

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.h
# Opt level: O0

void __thiscall CTcTokString::ensure_space(CTcTokString *this,size_t siz)

{
  void *pvVar1;
  long in_RSI;
  long in_RDI;
  
  if (*(ulong *)(in_RDI + 0x10) < in_RSI + 1U) {
    *(ulong *)(in_RDI + 0x10) = in_RSI + 0x1000U & 0xfffffffffffff000;
    if (*(long *)(in_RDI + 8) == 0) {
      pvVar1 = malloc(*(size_t *)(in_RDI + 0x10));
      *(void **)(in_RDI + 8) = pvVar1;
    }
    else {
      pvVar1 = realloc(*(void **)(in_RDI + 8),*(size_t *)(in_RDI + 0x10));
      *(void **)(in_RDI + 8) = pvVar1;
    }
    if (*(long *)(in_RDI + 8) == 0) {
      err_throw(0);
    }
  }
  return;
}

Assistant:

virtual void ensure_space(size_t siz)
    {
        /* make sure there's room for the requested size plus a null byte */
        if (buf_size_ < siz + 1)
        {
            /* increase to the next 4k increment */
            buf_size_ = (siz + 4095 + 1) & ~4095;
            
            /* allocate or re-allocate the buffer */
            if (buf_ == 0)
                buf_ = (char *)t3malloc(buf_size_);
            else
                buf_ = (char *)t3realloc(buf_, buf_size_);

            /* throw an error if that failed */
            if (buf_ == 0)
                err_throw(TCERR_NO_STRBUF_MEM);
        }
    }